

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O2

void __thiscall QHttpThreadDelegate::encryptedSlot(QHttpThreadDelegate *this)

{
  long in_FS_OFFSET;
  QHttpNetworkReply local_20 [8];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x150) != 0) {
    QHttpNetworkReply::sslConfiguration(local_20);
    sslConfigurationChanged(this,(QSslConfiguration *)local_20);
    QSslConfiguration::~QSslConfiguration((QSslConfiguration *)local_20);
    encrypted(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::encryptedSlot()
{
    if (!httpReply)
        return;

    emit sslConfigurationChanged(httpReply->sslConfiguration());
    emit encrypted();
}